

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O2

void INT_CMCondition_signal(CManager cm,int condition)

{
  CMControlList cl;
  int iVar1;
  CMCondition cond;
  CMControlList cl_00;
  
  cl = cm->control_list;
  iVar1 = CManager_locked(cm);
  if (iVar1 == 0) {
    puts("Not LOCKED!");
  }
  set_debug_flag(cm);
  cond = CMCondition_find(cl,condition);
  if (cond != (CMCondition)0x0) {
    cond->signaled = 1;
    CMCondition_trigger(cm,cond,cl_00);
    if (cl->has_thread == 0) {
      cm->abort_read_ahead = 1;
    }
    if (cl->cond_polling != 0) {
      CMwake_server_thread(cm);
      return;
    }
  }
  return;
}

Assistant:

extern void
INT_CMCondition_signal(CManager cm, int condition)
{
    CMCondition cond;
    CMControlList cl = cm->control_list;
    if(!CManager_locked(cm)) {
	printf("Not LOCKED!\n");
    }
    set_debug_flag(cm);
    cond = CMCondition_find(cl, condition);
    if (!cond) return;
    cond->signaled = 1;
    CMCondition_trigger(cm, cond, cl);
    if (cl->has_thread == 0) cm->abort_read_ahead = 1;
    if (cl->cond_polling) {
	/* wake the server thread in case we're not him */
	CMwake_server_thread(cm);
    }
}